

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O2

void __thiscall ProblemFOBSFireFightingFactored::SetYScopes(ProblemFOBSFireFightingFactored *this)

{
  ulong uVar1;
  ulong uVar2;
  uint i;
  Scope x;
  Scope allAgents;
  allocator<char> local_a9;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string local_50;
  
  uVar2 = 0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete
                                   .super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar1 <= uVar2) break;
    Scope::Insert((Scope *)&local_88,(Index)uVar2);
    uVar2 = (ulong)((Index)uVar2 + 1);
  }
  for (i = 0; uVar2 = (ulong)i,
      uVar2 < *(ulong *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                         field_0x710; i = i + 1) {
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (uVar2 != 0) {
      Scope::Insert((Scope *)&local_a8,i - 1);
    }
    Scope::Insert((Scope *)&local_a8,i);
    if (uVar2 < *(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                          field_0x710 - 1U) {
      Scope::Insert((Scope *)&local_a8,i + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<>",&local_a9);
    Scope::Scope((Scope *)&local_68,&local_50);
    TwoStageDynamicBayesianNetwork::SetSoI_Y
              (&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn,i,(Scope *)&local_a8,
               (Scope *)&local_88,(Scope *)&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void ProblemFOBSFireFightingFactored::SetYScopes()
{    
    //specify connections for the 2DBN
#if DEBUG_PFFF
    cout << "About to set the SoIs for all next-stage(NS) SFs Y..."<<endl;
#endif
    Scope allAgents;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        allAgents.Insert(agI);
    for(Index yI=0; yI < _m_nrHouses; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        if(yI > 0)
            x.Insert(yI-1);
        x.Insert(yI); // firelevel of house yI influenced by its PS firelevel
        if(yI < (_m_nrHouses-1) )
            x.Insert(yI+1);

        SetSoI_Y( yI, //sfacI = 0 -> house 0
                  x,
                  allAgents,
                  Scope("<>") // no interdependencies between next-stage FLs
                  );
    }
}